

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O2

unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>
bssl::CreateCertErrorParams1Der(char *name,Input der)

{
  CertErrorParams2Der *this;
  size_t in_RCX;
  Input der1;
  
  der1.data_.data_ = (uchar *)der.data_.size_;
  if (der.data_.data_ != (uchar *)0x0) {
    this = (CertErrorParams2Der *)operator_new(0x58);
    der1.data_.size_ = in_RCX;
    anon_unknown_0::CertErrorParams2Der::CertErrorParams2Der
              (this,(char *)der.data_.data_,der1,(char *)0x0,(Input)ZEXT816(0));
    *(CertErrorParams2Der **)name = this;
    return (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
              )name;
  }
  abort();
}

Assistant:

std::unique_ptr<CertErrorParams> CreateCertErrorParams1Der(const char *name,
                                                           der::Input der) {
  BSSL_CHECK(name);
  return std::make_unique<CertErrorParams2Der>(name, der, nullptr,
                                               der::Input());
}